

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtabbar.cpp
# Opt level: O2

int __thiscall QTabBarPrivate::init(QTabBarPrivate *this,EVP_PKEY_CTX *ctx)

{
  QWidget *parent;
  QWidget *pQVar1;
  TextElideMode TVar2;
  int iVar3;
  QToolButton *pQVar4;
  QStyle *pQVar5;
  long in_FS_OFFSET;
  undefined1 local_60 [16];
  QArrayDataPointer<char16_t> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  parent = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  pQVar4 = (QToolButton *)operator_new(0x28);
  QToolButton::QToolButton(pQVar4,parent);
  this->leftB = pQVar4;
  Qt::Literals::StringLiterals::operator____s((QString *)&local_50,L"ScrollLeftButton",0x10);
  QObject::doSetObjectName((QString *)pQVar4);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  QAbstractButton::setAutoRepeat(&this->leftB->super_QAbstractButton,true);
  local_50.d = (Data *)scrollTabs;
  local_50.ptr = (char16_t *)0x0;
  QObjectPrivate::connect<void(QAbstractButton::*)(bool),void(QTabBarPrivate::*)()>
            ((Object *)(local_60 + 8),(offset_in_QAbstractButton_to_subr)this->leftB,
             (Object *)QAbstractButton::clicked,0,(ConnectionType)this);
  QMetaObject::Connection::~Connection((Connection *)(local_60 + 8));
  QWidget::hide((QWidget *)this->leftB);
  pQVar4 = (QToolButton *)operator_new(0x28);
  QToolButton::QToolButton(pQVar4,parent);
  this->rightB = pQVar4;
  Qt::Literals::StringLiterals::operator____s((QString *)&local_50,L"ScrollRightButton",0x11);
  QObject::doSetObjectName((QString *)pQVar4);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  QAbstractButton::setAutoRepeat(&this->rightB->super_QAbstractButton,true);
  local_50.d = (Data *)scrollTabs;
  local_50.ptr = (char16_t *)0x0;
  QObjectPrivate::connect<void(QAbstractButton::*)(bool),void(QTabBarPrivate::*)()>
            ((Object *)local_60,(offset_in_QAbstractButton_to_subr)this->rightB,
             (Object *)QAbstractButton::clicked,0,(ConnectionType)this);
  QMetaObject::Connection::~Connection((Connection *)local_60);
  QWidget::hide((QWidget *)this->rightB);
  QWidget::setFocusPolicy(parent,TabFocus);
  pQVar1 = (QWidget *)this->leftB;
  QTabBar::tr((QString *)&local_50,"Scroll Left",(char *)0x0,-1);
  QWidget::setAccessibleName(pQVar1,(QString *)&local_50);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  pQVar1 = (QWidget *)this->rightB;
  QTabBar::tr((QString *)&local_50,"Scroll Right",(char *)0x0,-1);
  QWidget::setAccessibleName(pQVar1,(QString *)&local_50);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  QWidget::setSizePolicy(parent,(QSizePolicy)0x50000);
  pQVar5 = QWidget::style(parent);
  TVar2 = (**(code **)(*(long *)pQVar5 + 0xf0))(pQVar5,0x43,0,parent,0);
  this->elideMode = TVar2;
  pQVar5 = QWidget::style(parent);
  iVar3 = (**(code **)(*(long *)pQVar5 + 0xf0))(pQVar5,0x26,0,parent,0);
  *(ushort *)&this->field_0x2d0 =
       ((ushort)*(undefined4 *)&this->field_0x2d0 & 0xfff7) + (ushort)(iVar3 == 0) * 8;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QTabBarPrivate::init()
{
    Q_Q(QTabBar);
    leftB = new QToolButton(q);
    leftB->setObjectName(u"ScrollLeftButton"_s);
    leftB->setAutoRepeat(true);
    QObjectPrivate::connect(leftB, &QToolButton::clicked,
                            this, &QTabBarPrivate::scrollTabs);
    leftB->hide();
    rightB = new QToolButton(q);
    rightB->setObjectName(u"ScrollRightButton"_s);
    rightB->setAutoRepeat(true);
    QObjectPrivate::connect(rightB, &QToolButton::clicked,
                            this, &QTabBarPrivate::scrollTabs);
    rightB->hide();
#ifdef QT_KEYPAD_NAVIGATION
    if (QApplicationPrivate::keypadNavigationEnabled()) {
        leftB->setFocusPolicy(Qt::NoFocus);
        rightB->setFocusPolicy(Qt::NoFocus);
        q->setFocusPolicy(Qt::NoFocus);
    } else
#endif
        q->setFocusPolicy(Qt::TabFocus);

#if QT_CONFIG(accessibility)
    leftB->setAccessibleName(QTabBar::tr("Scroll Left"));
    rightB->setAccessibleName(QTabBar::tr("Scroll Right"));
#endif
    q->setSizePolicy(QSizePolicy::Preferred, QSizePolicy::Fixed);
    elideMode = Qt::TextElideMode(q->style()->styleHint(QStyle::SH_TabBar_ElideMode, nullptr, q));
    useScrollButtons = !q->style()->styleHint(QStyle::SH_TabBar_PreferNoArrows, nullptr, q);
}